

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

TArray<FName,_FName> * __thiscall
TArray<FName,_FName>::operator=(TArray<FName,_FName> *this,TArray<FName,_FName> *other)

{
  if (other != this) {
    if (this->Array != (FName *)0x0) {
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}